

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

SshChannel *
ssh2_lportfwd_open(ConnectionLayer *cl,char *hostname,int port,char *description,SocketPeerInfo *pi,
                  Channel *chan)

{
  ssh2_channel *c_00;
  PktOut *pPVar1;
  PktOut *pktout;
  ssh2_channel *c;
  ssh2_connection_state *s;
  Channel *chan_local;
  SocketPeerInfo *pi_local;
  char *description_local;
  int port_local;
  char *hostname_local;
  ConnectionLayer *cl_local;
  
  c_00 = (ssh2_channel *)safemalloc(1,0xc0,0);
  c_00->connlayer = (ssh2_connection_state *)&cl[-0xe].vt;
  ssh2_channel_init(c_00);
  c_00->halfopen = true;
  c_00->chan = chan;
  pPVar1 = ssh2_portfwd_chanopen
                     ((ssh2_connection_state *)&cl[-0xe].vt,c_00,hostname,port,description,pi);
  pq_base_push((PacketQueueBase *)cl[2].vt,&pPVar1->qnode);
  return &c_00->sc;
}

Assistant:

static SshChannel *ssh2_lportfwd_open(
    ConnectionLayer *cl, const char *hostname, int port,
    const char *description, const SocketPeerInfo *pi, Channel *chan)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);
    struct ssh2_channel *c = snew(struct ssh2_channel);
    PktOut *pktout;

    c->connlayer = s;
    ssh2_channel_init(c);
    c->halfopen = true;
    c->chan = chan;

    pktout = ssh2_portfwd_chanopen(s, c, hostname, port, description, pi);
    pq_push(s->ppl.out_pq, pktout);

    return &c->sc;
}